

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optional.hpp
# Opt level: O0

void __thiscall
nonstd::optional_lite::optional<tinyusdz::Animatable<tinyusdz::GeomCamera::Projection>>::
initialize<tinyusdz::Animatable<tinyusdz::GeomCamera::Projection>>
          (optional<tinyusdz::Animatable<tinyusdz::GeomCamera::Projection>> *this,
          Animatable<tinyusdz::GeomCamera::Projection> *value)

{
  bool bVar1;
  Animatable<tinyusdz::GeomCamera::Projection> *value_local;
  optional<tinyusdz::Animatable<tinyusdz::GeomCamera::Projection>_> *this_local;
  
  bVar1 = optional<tinyusdz::Animatable<tinyusdz::GeomCamera::Projection>_>::has_value
                    ((optional<tinyusdz::Animatable<tinyusdz::GeomCamera::Projection>_> *)this);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("! has_value()",
                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/nonstd/optional.hpp"
                  ,0x5dd,
                  "void nonstd::optional_lite::optional<tinyusdz::Animatable<tinyusdz::GeomCamera::Projection>>::initialize(V &&) [T = tinyusdz::Animatable<tinyusdz::GeomCamera::Projection>, V = tinyusdz::Animatable<tinyusdz::GeomCamera::Projection>]"
                 );
  }
  detail::storage_t<tinyusdz::Animatable<tinyusdz::GeomCamera::Projection>_>::construct_value
            ((storage_t<tinyusdz::Animatable<tinyusdz::GeomCamera::Projection>_> *)(this + 8),value)
  ;
  *this = (optional<tinyusdz::Animatable<tinyusdz::GeomCamera::Projection>>)0x1;
  return;
}

Assistant:

void initialize( V && value )
    {
        assert( ! has_value()  );
        contained.construct_value( std::move( value ) );
        has_value_ = true;
    }